

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_foreach_event_nolock_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  int iVar1;
  event *peVar2;
  event_callback *local_50;
  event_callback *evcb;
  common_timeout_list *ctl;
  event *ev;
  int local_30;
  uint u;
  int i;
  int r;
  void *arg_local;
  event_base_foreach_event_cb fn_local;
  event_base *base_local;
  
  base_local._4_4_ = evmap_foreach_event_(base,fn,arg);
  if (base_local._4_4_ == 0) {
    for (ev._4_4_ = 0; ev._4_4_ < (base->timeheap).n; ev._4_4_ = ev._4_4_ + 1) {
      peVar2 = (base->timeheap).p[ev._4_4_];
      if ((((peVar2->ev_evcallback).evcb_flags & 2U) == 0) &&
         (iVar1 = (*fn)(base,peVar2,arg), iVar1 != 0)) {
        return iVar1;
      }
    }
    for (local_30 = 0; local_30 < base->n_common_timeouts; local_30 = local_30 + 1) {
      for (ctl = (common_timeout_list *)(base->common_timeout_queues[local_30]->events).tqh_first;
          ctl != (common_timeout_list *)0x0;
          ctl = (common_timeout_list *)(ctl->timeout_event).ev_evcallback.evcb_active_next.tqe_prev)
      {
        if ((((ctl->duration).tv_sec & 2) == 0) &&
           (iVar1 = (*fn)(base,(event *)ctl,arg), iVar1 != 0)) {
          return iVar1;
        }
      }
    }
    for (local_30 = 0; local_30 < base->nactivequeues; local_30 = local_30 + 1) {
      for (local_50 = base->activequeues[local_30].tqh_first; local_50 != (event_callback *)0x0;
          local_50 = (local_50->evcb_active_next).tqe_next) {
        if ((local_50->evcb_flags & 0x83U) == 0x80) {
          peVar2 = event_callback_to_event(local_50);
          iVar1 = (*fn)(base,peVar2,arg);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
      }
    }
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_base_foreach_event_nolock_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	int r, i;
	unsigned u;
	struct event *ev;

	/* Start out with all the EVLIST_INSERTED events. */
	if ((r = evmap_foreach_event_(base, fn, arg)))
		return r;

	/* Okay, now we deal with those events that have timeouts and are in
	 * the min-heap. */
	for (u = 0; u < base->timeheap.n; ++u) {
		ev = base->timeheap.p[u];
		if (ev->ev_flags & EVLIST_INSERTED) {
			/* we already processed this one */
			continue;
		}
		if ((r = fn(base, ev, arg)))
			return r;
	}

	/* Now for the events in one of the timeout queues.
	 * the min-heap. */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		TAILQ_FOREACH(ev, &ctl->events,
		    ev_timeout_pos.ev_next_with_common_timeout) {
			if (ev->ev_flags & EVLIST_INSERTED) {
				/* we already processed this one */
				continue;
			}
			if ((r = fn(base, ev, arg)))
				return r;
		}
	}

	/* Finally, we deal wit all the active events that we haven't touched
	 * yet. */
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			if ((evcb->evcb_flags & (EVLIST_INIT|EVLIST_INSERTED|EVLIST_TIMEOUT)) != EVLIST_INIT) {
				/* This isn't an event (evlist_init clear), or
				 * we already processed it. (inserted or
				 * timeout set */
				continue;
			}
			ev = event_callback_to_event(evcb);
			if ((r = fn(base, ev, arg)))
				return r;
		}
	}

	return 0;
}